

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pairing.c
# Opt level: O3

int compute_6tplus2_naf(int **naf,int *naf_len,fp_struct_st *t)

{
  size_t size;
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  BIGNUM *a;
  int *ptr;
  int *ptr_00;
  ulong uVar6;
  int *piVar7;
  uint uVar8;
  ulong uVar9;
  
  a = BN_new();
  if (a == (BIGNUM *)0x0) {
    ptr = (int *)0x0;
    ptr_00 = (int *)0x0;
  }
  else {
    BN_set_words((BIGNUM *)a,t->d,4);
    BN_mul_word(a,6);
    BN_add_word(a,2);
    uVar2 = BN_num_bits(a);
    if ((int)uVar2 < 1) {
      ptr = (int *)0x0;
      ptr_00 = (int *)0x0;
    }
    else {
      uVar6 = (ulong)uVar2;
      size = uVar6 * 4 + 4;
      ptr = (int *)CRYPTO_zalloc(size);
      ptr_00 = (int *)CRYPTO_zalloc(size);
      if (ptr_00 != (int *)0x0 && ptr != (int *)0x0) {
        piVar7 = ptr;
        uVar9 = uVar6;
        do {
          iVar3 = BN_is_bit_set(a,(int)uVar9);
          *piVar7 = iVar3;
          piVar7 = piVar7 + 1;
          uVar9 = uVar9 - 1;
          uVar5 = uVar2;
        } while (uVar9 != 0);
        do {
          uVar4 = 1;
          if ((int)uVar5 < 1) {
            uVar4 = uVar5;
          }
          uVar8 = uVar5;
          do {
            if (ptr[uVar8] != 1) goto LAB_00123c07;
            bVar1 = 1 < (int)uVar8;
            uVar8 = uVar8 - 1;
          } while (bVar1);
          uVar8 = uVar4 - 1;
          if (2 < (int)uVar5 && uVar4 - 1 == 0) {
            ptr[uVar5] = -1;
            memset(ptr + ((ulong)(uVar5 - 1) - (ulong)(uVar5 - 2)),0,(ulong)(uVar5 - 1) * 4);
            *ptr = 1;
            uVar5 = 0;
            uVar8 = 0;
          }
LAB_00123c07:
          if ((int)(uVar5 - uVar8) < 2) {
            uVar5 = uVar5 - 1;
          }
          else {
            ptr[uVar5] = -1;
            uVar4 = uVar5 - 1;
            uVar5 = uVar4;
            for (; (int)uVar8 < (int)uVar4; uVar4 = uVar4 - 1) {
              ptr[uVar4] = 0;
              uVar5 = uVar8;
            }
            ptr[(int)uVar5] = 1;
          }
          if ((int)uVar5 < 1) {
            if (*ptr == 1) {
              memcpy(ptr_00,ptr,size);
              uVar2 = uVar2 + 1;
            }
            else {
              memcpy(ptr_00,ptr + 1,uVar6 << 2);
            }
            *naf = ptr_00;
            *naf_len = uVar2;
            CRYPTO_free(ptr);
            BN_free(a);
            return 1;
          }
        } while( true );
      }
    }
  }
  *naf = (int *)0x0;
  *naf_len = 0;
  CRYPTO_free(ptr);
  CRYPTO_free(ptr_00);
  BN_free(a);
  return 0;
}

Assistant:

int compute_6tplus2_naf(int **naf, int *naf_len, fp_t t)
{
    int bits, i, j;
    int *tmp = NULL;
    int *ret = NULL;
    BIGNUM *z = NULL;

    z = BN_new();
    if (z == NULL)
        goto end;

    BN_set_words(z, t->d, N_LIMBS);
    BN_mul_word(z, 6);
    BN_add_word(z, 2);
    bits = BN_num_bits(z);
    if (bits <= 0)
        goto end;

    tmp = (int*)CRYPTO_zalloc((bits + 1) * sizeof(int));
    ret = (int*)CRYPTO_zalloc((bits + 1) * sizeof(int));
    if (tmp == NULL || ret == NULL)
        goto end;

    for (i = 0; i < bits; i++)
        tmp[i] = BN_is_bit_set(z, bits - i);

    i = bits;
    while (i > 0) {
        j = i;
        while (j > 0 && tmp[j] == 1)
            j--;

        if (j == 0) {
            if ((i - j) >= 3) {
                tmp[i] = -1;
                i--;
                while (i > j) {
                    tmp[i] = 0;
                    i--;
                }
                tmp[i] = 1;
            }
        }

        /* ***11*** --> **10-1*** */
        if ((i - j) >= 2) {
            tmp[i] = -1;
            i--;
            while (i > j) {
                tmp[i] = 0;
                i--;
            }
            tmp[i] = 1;
        }
        else
            i--;
    }

    if (tmp[0] == 1) {
        memcpy(ret, tmp, (bits + 1) * sizeof(int));
        *naf = ret;
        *naf_len = (bits + 1);
    }
    else {
        memcpy(ret, tmp + 1, bits * sizeof(int));
        *naf = ret;
        *naf_len = bits;
    }

    CRYPTO_free(tmp);
    BN_free(z);
    return GML_OK;
end:
    *naf = NULL;
    *naf_len = 0;
    CRYPTO_free(tmp);
    CRYPTO_free(ret);
    BN_free(z);
    return GML_ERROR;
}